

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O0

void dequantize_row_q4_1(block_q4_1 *x,float *y,int64_t k)

{
  byte bVar1;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  float fVar2;
  float fVar3;
  int x1;
  int x0;
  int j;
  float m;
  float d;
  int i;
  int nb;
  undefined4 local_2c;
  undefined4 local_20;
  
  for (local_20 = 0; local_20 < (int)(in_RDX / 0x20); local_20 = local_20 + 1) {
    fVar2 = ggml_lookup_fp16_to_fp32(*(ggml_fp16_t *)(in_RDI + (long)local_20 * 0x14));
    fVar3 = ggml_lookup_fp16_to_fp32(*(ggml_fp16_t *)(in_RDI + (long)local_20 * 0x14 + 2));
    for (local_2c = 0; local_2c < 0x10; local_2c = local_2c + 1) {
      bVar1 = *(byte *)(in_RDI + (long)local_20 * 0x14 + 4 + (long)local_2c);
      *(float *)(in_RSI + (long)(local_20 * 0x20 + local_2c) * 4) =
           (float)(*(byte *)(in_RDI + (long)local_20 * 0x14 + 4 + (long)local_2c) & 0xf) * fVar2 +
           fVar3;
      *(float *)(in_RSI + (long)(local_20 * 0x20 + local_2c + 0x10) * 4) =
           (float)((int)(uint)bVar1 >> 4) * fVar2 + fVar3;
    }
  }
  return;
}

Assistant:

void dequantize_row_q4_1(const block_q4_1 * GGML_RESTRICT x, float * GGML_RESTRICT y, int64_t k) {
    static const int qk = QK4_1;

    assert(k % qk == 0);

    const int nb = k / qk;

    for (int i = 0; i < nb; i++) {
        const float d = GGML_FP16_TO_FP32(x[i].d);
        const float m = GGML_FP16_TO_FP32(x[i].m);

        for (int j = 0; j < qk/2; ++j) {
            const int x0 = (x[i].qs[j] & 0x0F);
            const int x1 = (x[i].qs[j] >>   4);

            y[i*qk + j + 0   ] = x0*d + m;
            y[i*qk + j + qk/2] = x1*d + m;
        }
    }
}